

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

void __thiscall
vmips::callfunc::collect_register(callfunc *this,unordered_set<std::shared_ptr<VirtReg>_> *set)

{
  element_type *peVar1;
  shared_ptr<vmips::VirtReg> *psVar2;
  shared_ptr<vmips::VirtReg> *key;
  shared_ptr<vmips::VirtReg> *i;
  shared_ptr<vmips::VirtReg> *key_00;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::iterator,_bool>
  pStack_58;
  
  peVar1 = (this->ret).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (peVar1->allocated == false)) {
    phmap::priv::
    parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
    ::emplace_decomposable<std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>const&>
              (&pStack_58,
               (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
                *)set,&this->ret,&this->ret);
  }
  psVar2 = (this->call_with).
           super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (key_00 = (this->call_with).
                super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                ._M_impl.super__Vector_impl_data._M_start; key_00 != psVar2; key_00 = key_00 + 1) {
    if (((key_00->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->allocated
        == false) {
      phmap::priv::
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
      ::emplace_decomposable<std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::VirtReg>const&>
                (&pStack_58,
                 (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>,phmap::priv::HashEq<vmips::VirtReg*,void>::Hash,phmap::priv::HashEq<vmips::VirtReg*,void>::Eq,std::allocator<std::shared_ptr<vmips::VirtReg>>>
                  *)set,key_00,key_00);
    }
  }
  return;
}

Assistant:

void callfunc::collect_register(unordered_set<std::shared_ptr<VirtReg>> &set) const {
    if (ret && !ret->allocated) set.insert(ret);
    for (auto &i : call_with) {
        if (!i->allocated) {
            set.insert(i);
        }
    }
}